

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O0

Pass * wasm::createTraceCallsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  TraceCalls::TraceCalls((TraceCalls *)this);
  return this;
}

Assistant:

Pass* createTraceCallsPass() { return new TraceCalls(); }